

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall capnp::compiler::ModuleLoader::~ModuleLoader(ModuleLoader *this)

{
  if ((this->impl).ptr != (Impl *)0x0) {
    (this->impl).ptr = (Impl *)0x0;
    (**((this->impl).disposer)->_vptr_Disposer)();
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }